

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actorptrselect.cpp
# Opt level: O0

void VerifyTargetChain(AActor *self,bool preciseMissileCheck)

{
  bool bVar1;
  bool local_31;
  AActor *local_30;
  AActor *compare;
  AActor *next;
  AActor *origin;
  bool preciseMissileCheck_local;
  AActor *self_local;
  
  if ((self != (AActor *)0x0) && (bVar1 = AActor::isMissile(self,preciseMissileCheck), bVar1)) {
    compare = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self->target);
    next = self;
    while( true ) {
      local_31 = false;
      if (compare != (AActor *)0x0) {
        local_31 = AActor::isMissile(compare,preciseMissileCheck);
      }
      local_30 = self;
      if (local_31 == false) break;
      while( true ) {
        if (local_30 == compare) {
          TObjPtr<AActor>::operator=(&self->target,(AActor *)0x0);
          return;
        }
        if (local_30 == next) break;
        local_30 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_30->target);
      }
      next = compare;
      compare = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&compare->target);
    }
  }
  return;
}

Assistant:

void VerifyTargetChain(AActor *self, bool preciseMissileCheck)
{
	if (!self || !self->isMissile(preciseMissileCheck)) return;

	AActor *origin = self;
	AActor *next = origin->target;

	// origin: the most recent actor that has been verified as appearing only once
	// next: the next actor to be verified; will be "origin" in the next iteration

	while (next && next->isMissile(preciseMissileCheck)) // we only care when there are missiles involved
	{
		AActor *compare = self;
		// every new actor must prove not to be the first actor in the chain, or any subsequent actor
		// any actor up to and including "origin" has only appeared once
		for (;;)
 		{
			if (compare == next)
			{
				// if any of the actors from self to (inclusive) origin match the next actor,
				// self has reached/created a loop
				self->target = NULL;
				return;
			}
			if (compare == origin) break; // when "compare" = origin, we know that the next actor is, and should be "next"
			compare = compare->target;
		}

		origin = next;
		next = next->target;
	}
}